

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O3

size_t __thiscall
embree::FastAllocator::Block::getUsedBytes(Block *this,AllocationType atype,bool huge_pages)

{
  ulong uVar1;
  size_t bytes;
  ulong uVar2;
  
  bytes = 0;
  do {
    if (atype == ANY_TYPE) {
LAB_00b7b5d9:
      uVar1 = (this->cur).super___atomic_base<unsigned_long>._M_i;
      uVar2 = (this->reserveEnd).super___atomic_base<unsigned_long>._M_i;
      if (uVar1 < uVar2) {
        uVar2 = uVar1;
      }
      bytes = bytes + uVar2;
    }
    else if (this->atype == EMBREE_OS_MALLOC) {
      if ((atype == EMBREE_OS_MALLOC) && (this->huge_pages == huge_pages)) goto LAB_00b7b5d9;
    }
    else if (this->atype == atype) goto LAB_00b7b5d9;
    this = this->next;
    if (this == (Block *)0x0) {
      return bytes;
    }
  } while( true );
}

Assistant:

size_t getUsedBytes(AllocationType atype, bool huge_pages = false) const {
        size_t bytes = 0;
        for (const Block* block = this; block; block = block->next) {
          if (!block->hasType(atype,huge_pages)) continue;
          bytes += block->getBlockUsedBytes();
        }
        return bytes;
      }